

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMDBitSet.cpp
# Opt level: O0

bool __thiscall OpenMD::OpenMDBitSet::none(OpenMDBitSet *this)

{
  _Bit_iterator __first;
  undefined1 auVar1 [12];
  bool bVar2;
  vector<bool,_std::allocator<bool>_> *in_RDI;
  iterator iVar3;
  _Bit_iterator _Var4;
  iterator i;
  _Bit_iterator_base local_80;
  _Bit_type *local_70;
  uint local_68;
  undefined7 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffc4;
  _Bit_iterator_base local_18;
  
  std::vector<bool,_std::allocator<bool>_>::begin((vector<bool,_std::allocator<bool>_> *)0x382f10);
  iVar3 = std::vector<bool,_std::allocator<bool>_>::end(in_RDI);
  auVar1 = iVar3.super__Bit_iterator_base._0_12_;
  __first.super__Bit_iterator_base._12_4_ = in_stack_ffffffffffffffc4;
  __first.super__Bit_iterator_base._M_p = (_Bit_type *)auVar1._0_8_;
  __first.super__Bit_iterator_base._M_offset = auVar1._8_4_;
  _Var4.super__Bit_iterator_base._12_4_ = in_stack_ffffffffffffffb4;
  _Var4.super__Bit_iterator_base._M_p = (_Bit_type *)auVar1._0_8_;
  _Var4.super__Bit_iterator_base._M_offset = auVar1._8_4_;
  _Var4 = std::find<std::_Bit_iterator,bool>
                    (__first,_Var4,(bool *)CONCAT17(1,in_stack_ffffffffffffffa0));
  local_70 = _Var4.super__Bit_iterator_base._M_p;
  local_68 = _Var4.super__Bit_iterator_base._M_offset;
  local_18._M_p = local_70;
  local_18._M_offset = local_68;
  iVar3 = std::vector<bool,_std::allocator<bool>_>::end(in_RDI);
  local_80._M_p = iVar3.super__Bit_iterator_base._M_p;
  local_80._M_offset = iVar3.super__Bit_iterator_base._M_offset;
  bVar2 = std::operator==(&local_18,&local_80);
  return (bool)(-bVar2 & 1);
}

Assistant:

bool OpenMDBitSet::none() {
    std::vector<bool>::iterator i =
        std::find(bitset_.begin(), bitset_.end(), true);
    return i == bitset_.end() ? true : false;
  }